

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void __thiscall
duckdb::FSSTCompressionState::UpdateState
          (FSSTCompressionState *this,string_t uncompressed_string,uchar *compressed_string,
          size_t compressed_string_len)

{
  atomic<unsigned_long> *paVar1;
  bool bVar2;
  bitpacking_width_t bVar3;
  uint uVar4;
  pointer pCVar5;
  InternalException *this_00;
  allocator local_59;
  string_t uncompressed_string_local;
  string local_48;
  
  uncompressed_string_local.value.pointer.ptr = (char *)uncompressed_string.value._8_8_;
  uncompressed_string_local.value._0_8_ = uncompressed_string.value._0_8_;
  bVar2 = HasEnoughSpace(this,compressed_string_len);
  if (!bVar2) {
    Flush(this,false);
    bVar2 = HasEnoughSpace(this,compressed_string_len);
    if (!bVar2) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_48,
                 "FSST string compression failed due to insufficient space in empty block",&local_59
                );
      InternalException::InternalException(this_00,&local_48);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  StringStats::Update(&(pCVar5->stats).statistics,&uncompressed_string_local);
  uVar4 = (this->current_dictionary).size + (int)compressed_string_len;
  (this->current_dictionary).size = uVar4;
  switchD_01939fa4::default
            (this->current_end_ptr + -(ulong)uVar4,compressed_string,compressed_string_len);
  CompressionInfo::GetBlockSize(&(this->super_CompressionState).info);
  local_48._M_dataplus._M_p._0_4_ =
       NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(compressed_string_len);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&(this->index_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
             (uint *)&local_48);
  if (compressed_string_len < this->max_compressed_string_length) {
    compressed_string_len = this->max_compressed_string_length;
  }
  this->max_compressed_string_length = compressed_string_len;
  bVar3 = BitpackingPrimitives::MinimumBitWidth<unsigned_long,false>(compressed_string_len);
  this->current_width = bVar3;
  pCVar5 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar5->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void UpdateState(string_t uncompressed_string, unsigned char *compressed_string, size_t compressed_string_len) {
		if (!HasEnoughSpace(compressed_string_len)) {
			Flush();
			if (!HasEnoughSpace(compressed_string_len)) {
				throw InternalException("FSST string compression failed due to insufficient space in empty block");
			};
		}

		UncompressedStringStorage::UpdateStringStats(current_segment->stats, uncompressed_string);

		// Write string into dictionary
		current_dictionary.size += compressed_string_len;
		auto dict_pos = current_end_ptr - current_dictionary.size;
		memcpy(dict_pos, compressed_string, compressed_string_len);
		current_dictionary.Verify(info.GetBlockSize());

		// We just push the string length to effectively delta encode the strings
		index_buffer.push_back(NumericCast<uint32_t>(compressed_string_len));

		max_compressed_string_length = MaxValue(max_compressed_string_length, compressed_string_len);

		current_width = BitpackingPrimitives::MinimumBitWidth(max_compressed_string_length);
		current_segment->count++;
	}